

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssxmlExporter.cpp
# Opt level: O1

void Assimp::AssxmlExport::WriteNode(aiNode *node,IOStream *io,uint depth)

{
  ulong uVar1;
  char prefix [512];
  aiString name;
  undefined1 local_638 [524];
  aiString local_42c;
  
  if (depth != 0) {
    memset(local_638,9,(ulong)depth);
  }
  local_638[depth] = 0;
  local_42c.length = 0;
  local_42c.data[0] = '\0';
  memset(local_42c.data + 1,0x1b,0x3ff);
  ConvertName(&local_42c,&node->mName);
  ioprintf(io,
           "%s<Node name=\"%s\"> \n%s\t<Matrix4> \n%s\t\t%0 6f %0 6f %0 6f %0 6f\n%s\t\t%0 6f %0 6f %0 6f %0 6f\n%s\t\t%0 6f %0 6f %0 6f %0 6f\n%s\t\t%0 6f %0 6f %0 6f %0 6f\n%s\t</Matrix4> \n"
           ,(double)(node->mTransformation).a1,(double)(node->mTransformation).a2,
           (double)(node->mTransformation).a3,(double)(node->mTransformation).a4,
           (double)(node->mTransformation).b1,(double)(node->mTransformation).b2,
           (double)(node->mTransformation).b3,(double)(node->mTransformation).b4,local_638,
           local_42c.data,local_638,local_638,local_638,local_638,(double)(node->mTransformation).c1
           ,(double)(node->mTransformation).c2,(double)(node->mTransformation).c3,
           (double)(node->mTransformation).c4,local_638,(double)(node->mTransformation).d1,
           (double)(node->mTransformation).d2,(double)(node->mTransformation).d3,
           (double)(node->mTransformation).d4,local_638);
  if (node->mNumMeshes != 0) {
    ioprintf(io,"%s\t<MeshRefs num=\"%i\">\n%s\t",local_638,(ulong)node->mNumMeshes,local_638);
    if (node->mNumMeshes != 0) {
      uVar1 = 0;
      do {
        ioprintf(io,"%i ",(ulong)node->mMeshes[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < node->mNumMeshes);
    }
    ioprintf(io,"\n%s\t</MeshRefs>\n",local_638);
  }
  if (node->mNumChildren != 0) {
    ioprintf(io,"%s\t<NodeList num=\"%i\">\n",local_638);
    if (node->mNumChildren != 0) {
      uVar1 = 0;
      do {
        WriteNode(node->mChildren[uVar1],io,depth + 2);
        uVar1 = uVar1 + 1;
      } while (uVar1 < node->mNumChildren);
    }
    ioprintf(io,"%s\t</NodeList>\n",local_638);
  }
  ioprintf(io,"%s</Node>\n",local_638);
  return;
}

Assistant:

static void WriteNode(const aiNode* node, IOStream * io, unsigned int depth) {
    char prefix[512];
    for (unsigned int i = 0; i < depth;++i)
        prefix[i] = '\t';
    prefix[depth] = '\0';

    const aiMatrix4x4& m = node->mTransformation;

    aiString name;
    ConvertName(name,node->mName);
    ioprintf(io,"%s<Node name=\"%s\"> \n"
        "%s\t<Matrix4> \n"
        "%s\t\t%0 6f %0 6f %0 6f %0 6f\n"
        "%s\t\t%0 6f %0 6f %0 6f %0 6f\n"
        "%s\t\t%0 6f %0 6f %0 6f %0 6f\n"
        "%s\t\t%0 6f %0 6f %0 6f %0 6f\n"
        "%s\t</Matrix4> \n",
        prefix,name.data,prefix,
        prefix,m.a1,m.a2,m.a3,m.a4,
        prefix,m.b1,m.b2,m.b3,m.b4,
        prefix,m.c1,m.c2,m.c3,m.c4,
        prefix,m.d1,m.d2,m.d3,m.d4,prefix);

    if (node->mNumMeshes) {
        ioprintf(io, "%s\t<MeshRefs num=\"%i\">\n%s\t",
            prefix,node->mNumMeshes,prefix);

        for (unsigned int i = 0; i < node->mNumMeshes;++i) {
            ioprintf(io,"%i ",node->mMeshes[i]);
        }
        ioprintf(io,"\n%s\t</MeshRefs>\n",prefix);
    }

    if (node->mNumChildren) {
        ioprintf(io,"%s\t<NodeList num=\"%i\">\n",
            prefix,node->mNumChildren);

        for (unsigned int i = 0; i < node->mNumChildren;++i) {
            WriteNode(node->mChildren[i],io,depth+2);
        }
        ioprintf(io,"%s\t</NodeList>\n",prefix);
    }
    ioprintf(io,"%s</Node>\n",prefix);
}